

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

TimerId __thiscall
sznet::TimerQueue::addTimer(TimerQueue *this,TimerCallback *cb,Timestamp when,double interval)

{
  EventLoop *this_00;
  _Manager_type p_Var1;
  long lVar2;
  TimerId TVar3;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  double local_38;
  
  local_38 = interval;
  TVar3.m_timer = (Timer *)operator_new(0x48);
  std::function<void_()>::function((function<void_()> *)&local_58,cb);
  p_Var1 = local_48;
  ((TVar3.m_timer)->super_MinHeaBaseElem).min_heap_idx = -1;
  ((TVar3.m_timer)->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&((TVar3.m_timer)->m_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&((TVar3.m_timer)->m_callback).super__Function_base._M_functor + 8) = 0;
  ((TVar3.m_timer)->m_callback)._M_invoker = p_Stack_40;
  if (local_48 != (_Manager_type)0x0) {
    local_48 = (_Manager_type)0x0;
    p_Stack_40 = (_Invoker_type)0x0;
    *(void **)&((TVar3.m_timer)->m_callback).super__Function_base._M_functor =
         local_58._M_unused._M_object;
    *(undefined8 *)((long)&((TVar3.m_timer)->m_callback).super__Function_base._M_functor + 8) =
         local_58._8_8_;
    ((TVar3.m_timer)->m_callback).super__Function_base._M_manager = p_Var1;
  }
  ((TVar3.m_timer)->m_expiration).m_microSecondsSinceEpoch = when.m_microSecondsSinceEpoch;
  (TVar3.m_timer)->m_interval = local_38;
  (TVar3.m_timer)->m_repeat = 0.0 < local_38;
  LOCK();
  UNLOCK();
  lVar2 = Timer::m_s_numCreated + 1;
  (TVar3.m_timer)->m_sequence = Timer::m_s_numCreated;
  Timer::m_s_numCreated = lVar2;
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  this_00 = this->m_loop;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x20);
  *(code **)local_78._M_unused._0_8_ = addTimerInLoop;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(Timer **)((long)local_78._M_unused._0_8_ + 0x10) = TVar3.m_timer;
  local_60 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::Timer_*))(sznet::Timer_*)>_>
             ::_M_invoke;
  *(TimerQueue **)((long)local_78._M_unused._0_8_ + 0x18) = this;
  local_68 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::Timer_*))(sznet::Timer_*)>_>
             ::_M_manager;
  net::EventLoop::runInLoop(this_00,(Functor *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  TVar3.m_sequence = (TVar3.m_timer)->m_sequence;
  return TVar3;
}

Assistant:

TimerId TimerQueue::addTimer(const net::TimerCallback cb, Timestamp when, double interval)
{
	Timer* timer = new Timer(cb, when, interval);
	m_loop->runInLoop(std::bind(&TimerQueue::addTimerInLoop, this, timer));
	return TimerId(timer, timer->sequence());
}